

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportModelSolution(HModel *this)

{
  int iVar1;
  vector<double,_std::allocator<double>_> *XcolDual;
  HModel *this_00;
  HModel *this_01;
  vector<double,_std::allocator<double>_> *XcolUpper;
  vector<double,_std::allocator<double>_> *XrowPrimal;
  vector<double,_std::allocator<double>_> *this_02;
  long in_RDI;
  vector<int,_std::allocator<int>_> rowStatus;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowPrimal;
  vector<int,_std::allocator<int>_> colStatus;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> colPrimal;
  HModel *in_stack_fffffffffffffea0;
  HModel *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *XcolPrimal;
  vector<double,_std::allocator<double>_> *XcolLower;
  int *rstat;
  HModel *this_03;
  vector<int,_std::allocator<int>_> *XcolStatus;
  undefined1 local_d1 [49];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  HModel *in_stack_ffffffffffffff80;
  undefined1 local_71 [32];
  vector<int,_std::allocator<int>_> local_51 [3];
  
  printf("util_reportModelSolution:\n");
  util_reportModelDimensions(in_stack_fffffffffffffeb0);
  util_reportModelObjSense(in_stack_fffffffffffffea0);
  util_reportModelStatus(in_stack_fffffffffffffea0);
  if (*(int *)(in_RDI + 0x614) < 0x65) {
    std::allocator<double>::allocator((allocator<double> *)0x185cc3);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<double>::~allocator((allocator<double> *)0x185cec);
    XcolDual = (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x60c);
    XcolStatus = local_51;
    std::allocator<double>::allocator((allocator<double> *)0x185d12);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<double>::~allocator((allocator<double> *)0x185d38);
    this_00 = (HModel *)(long)*(int *)(in_RDI + 0x60c);
    this_03 = (HModel *)local_71;
    std::allocator<int>::allocator((allocator<int> *)0x185d5e);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<int>::~allocator((allocator<int> *)0x185d84);
    this_01 = (HModel *)(long)*(int *)(in_RDI + 0x610);
    rstat = (int *)&stack0xffffffffffffff6f;
    std::allocator<double>::allocator((allocator<double> *)0x185daa);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<double>::~allocator((allocator<double> *)0x185dd0);
    XcolUpper = (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x610);
    XcolLower = (vector<double,_std::allocator<double>_> *)(local_d1 + 0x20);
    std::allocator<double>::allocator((allocator<double> *)0x185df6);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffec0,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<double>::~allocator((allocator<double> *)0x185e1c);
    XrowPrimal = (vector<double,_std::allocator<double>_> *)(long)*(int *)(in_RDI + 0x610);
    XcolPrimal = (vector<double,_std::allocator<double>_> *)local_d1;
    std::allocator<int>::allocator((allocator<int> *)0x185e42);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)XrowPrimal,
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (allocator_type *)in_stack_fffffffffffffeb0);
    std::allocator<int>::~allocator((allocator<int> *)0x185e68);
    util_getPrimalDualValues
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    this_02 = (vector<double,_std::allocator<double>_> *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(local_71 + 1),0);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_d1 + 1),0);
    iVar1 = util_convertWorkingToBaseStat(this_03,this_00->intOption,rstat);
    if (iVar1 == 0) {
      util_reportColVecSol
                (this_00,(int)((ulong)rstat >> 0x20),
                 (vector<double,_std::allocator<double>_> *)this_01,XcolLower,XcolUpper,XcolPrimal,
                 XcolDual,XcolStatus);
      util_reportRowVecSol
                (this_01,(int)((ulong)XcolLower >> 0x20),XcolUpper,XcolPrimal,XrowPrimal,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(iVar1,in_stack_fffffffffffffeb8),
                 (vector<int,_std::allocator<int>_> *)this_00);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
    std::vector<double,_std::allocator<double>_>::~vector(this_02);
    std::vector<double,_std::allocator<double>_>::~vector(this_02);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
    std::vector<double,_std::allocator<double>_>::~vector(this_02);
    std::vector<double,_std::allocator<double>_>::~vector(this_02);
  }
  return;
}

Assistant:

void HModel::util_reportModelSolution() {
#ifdef JAJH_dev
  printf("util_reportModelSolution:\n");
#endif
  util_reportModelDimensions();
  util_reportModelObjSense();
  util_reportModelStatus();
  if (numTot>100) return;
  assert(numCol>0);
  assert(numRow>0);
  vector<double> colPrimal(numCol);
  vector<double> colDual(numCol);
  vector<int> colStatus(numCol);
  vector<double> rowPrimal(numRow);
  vector<double> rowDual(numRow);
  vector<int> rowStatus(numRow);
  util_getPrimalDualValues(colPrimal, colDual, rowPrimal, rowDual);
  if (util_convertWorkingToBaseStat(&colStatus[0], &rowStatus[0])) return;
  util_reportColVecSol(numCol, colCost, colLower, colUpper, colPrimal, colDual, colStatus);
  util_reportRowVecSol(numRow, rowLower, rowUpper, rowPrimal, rowDual, rowStatus);
}